

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

typed_option<unsigned_long> * __thiscall
VW::config::typed_option<unsigned_long>::value
          (typed_option<unsigned_long> *this,unsigned_long value)

{
  typed_option<unsigned_long> *in_RDI;
  unsigned_long *in_stack_00000008;
  shared_ptr<unsigned_long> *in_stack_ffffffffffffffe0;
  
  std::make_shared<unsigned_long,unsigned_long&>(in_stack_00000008);
  std::shared_ptr<unsigned_long>::operator=
            (in_stack_ffffffffffffffe0,(shared_ptr<unsigned_long> *)in_RDI);
  std::shared_ptr<unsigned_long>::~shared_ptr((shared_ptr<unsigned_long> *)0x142235);
  return in_RDI;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }